

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O0

int __thiscall
google::protobuf::stringpiece_internal::StringPiece::compare(StringPiece *this,StringPiece x)

{
  int iVar1;
  ulong uVar2;
  size_t local_48;
  int r;
  size_type min_size;
  StringPiece *this_local;
  StringPiece x_local;
  
  uVar2 = x.length_;
  local_48 = uVar2;
  if (this->length_ < uVar2) {
    local_48 = this->length_;
  }
  iVar1 = memcmp(this->ptr_,x.ptr_,local_48);
  if (iVar1 < 0) {
    x_local.length_._4_4_ = -1;
  }
  else if (iVar1 < 1) {
    if (this->length_ < uVar2) {
      x_local.length_._4_4_ = -1;
    }
    else if (uVar2 < this->length_) {
      x_local.length_._4_4_ = 1;
    }
    else {
      x_local.length_._4_4_ = 0;
    }
  }
  else {
    x_local.length_._4_4_ = 1;
  }
  return x_local.length_._4_4_;
}

Assistant:

int compare(StringPiece x) const {
    size_type min_size = length_ < x.length_ ? length_ : x.length_;
    int r = memcmp(ptr_, x.ptr_, static_cast<size_t>(min_size));
    if (r < 0) return -1;
    if (r > 0) return 1;
    if (length_ < x.length_) return -1;
    if (length_ > x.length_) return 1;
    return 0;
  }